

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1.h
# Opt level: O3

void ncnn::conv1x1s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  float *pfVar20;
  float *pfVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  float *pfVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  float *pfVar30;
  float *pfVar31;
  long lVar32;
  float *pfVar33;
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined1 auVar36 [16];
  int iVar38;
  undefined1 auVar37 [16];
  int remain;
  
  auVar15 = _DAT_0015d310;
  auVar14 = _DAT_0015d300;
  auVar13 = _DAT_0015d1a0;
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    uVar3 = bottom_blob->c;
    lVar17 = (long)(int)uVar3;
    iVar4 = top_blob->w;
    iVar5 = top_blob->h;
    pvVar6 = _kernel->data;
    pvVar7 = _bias->data;
    iVar22 = bottom_blob->w * 2 + iVar4 * -2;
    lVar24 = top_blob->cstep * top_blob->elemsize;
    pvVar8 = top_blob->data;
    uVar16 = iVar5 * iVar4;
    pvVar9 = bottom_blob->data;
    lVar27 = bottom_blob->cstep * bottom_blob->elemsize;
    lVar18 = (ulong)uVar16 - 1;
    auVar34._8_4_ = (int)lVar18;
    auVar34._0_8_ = lVar18;
    auVar34._12_4_ = (int)((ulong)lVar18 >> 0x20);
    lVar18 = (long)pvVar8 + 0xc;
    auVar34 = auVar34 ^ _DAT_0015d1a0;
    lVar32 = 0;
    do {
      if (pvVar7 == (void *)0x0) {
        uVar35 = 0;
      }
      else {
        uVar35 = *(undefined4 *)((long)pvVar7 + lVar32 * 4);
      }
      if (0 < (int)uVar16) {
        uVar19 = 0;
        do {
          auVar36._8_4_ = (int)uVar19;
          auVar36._0_8_ = uVar19;
          auVar36._12_4_ = (int)(uVar19 >> 0x20);
          auVar37 = (auVar36 | auVar15) ^ auVar13;
          iVar26 = auVar34._4_4_;
          if ((bool)(~(iVar26 < auVar37._4_4_ ||
                      auVar34._0_4_ < auVar37._0_4_ && auVar37._4_4_ == iVar26) & 1)) {
            *(undefined4 *)(lVar18 + -0xc + uVar19 * 4) = uVar35;
          }
          if (auVar37._12_4_ <= auVar34._12_4_ &&
              (auVar37._8_4_ <= auVar34._8_4_ || auVar37._12_4_ != auVar34._12_4_)) {
            *(undefined4 *)(lVar18 + -8 + uVar19 * 4) = uVar35;
          }
          auVar36 = (auVar36 | auVar14) ^ auVar13;
          iVar38 = auVar36._4_4_;
          if (iVar38 <= iVar26 && (iVar38 != iVar26 || auVar36._0_4_ <= auVar34._0_4_)) {
            *(undefined4 *)(lVar18 + -4 + uVar19 * 4) = uVar35;
            *(undefined4 *)(lVar18 + uVar19 * 4) = uVar35;
          }
          uVar19 = uVar19 + 4;
        } while ((uVar16 + 3 & 0xfffffffc) != uVar19);
      }
      pfVar25 = (float *)(lVar24 * lVar32 + (long)pvVar8);
      uVar19 = 0;
      if (3 < (int)uVar3) {
        uVar28 = 0;
        do {
          if (0 < iVar5) {
            pfVar20 = (float *)((long)pvVar6 + uVar28 * 4 + lVar32 * lVar17 * 4);
            fVar1 = *pfVar20;
            fVar10 = pfVar20[1];
            fVar11 = pfVar20[2];
            fVar12 = pfVar20[3];
            pfVar21 = (float *)((uVar28 | 3) * lVar27 + (long)pvVar9);
            pfVar33 = (float *)((uVar28 | 2) * lVar27 + (long)pvVar9);
            pfVar20 = (float *)((uVar28 | 1) * lVar27 + (long)pvVar9);
            pfVar30 = (float *)(lVar27 * uVar28 + (long)pvVar9);
            iVar26 = 0;
            pfVar31 = pfVar25;
            do {
              uVar23 = iVar4 + 1U;
              if (0 < iVar4) {
                do {
                  *pfVar31 = *pfVar21 * fVar12 + *pfVar20 * fVar10 +
                             *pfVar33 * fVar11 + *pfVar30 * fVar1 + *pfVar31;
                  pfVar30 = pfVar30 + 2;
                  pfVar20 = pfVar20 + 2;
                  pfVar33 = pfVar33 + 2;
                  pfVar21 = pfVar21 + 2;
                  pfVar31 = pfVar31 + 1;
                  uVar23 = uVar23 - 1;
                } while (1 < uVar23);
              }
              pfVar30 = pfVar30 + iVar22;
              pfVar20 = pfVar20 + iVar22;
              pfVar33 = pfVar33 + iVar22;
              pfVar21 = pfVar21 + iVar22;
              iVar26 = iVar26 + 1;
            } while (iVar26 != iVar5);
          }
          uVar19 = uVar28 + 4;
          lVar29 = uVar28 + 7;
          uVar28 = uVar19;
        } while (lVar29 < lVar17);
      }
      if ((int)uVar19 < (int)uVar3) {
        uVar19 = uVar19 & 0xffffffff;
        do {
          if (0 < iVar5) {
            fVar1 = *(float *)((long)pvVar6 + uVar19 * 4 + lVar32 * lVar17 * 4);
            pfVar20 = (float *)(lVar27 * uVar19 + (long)pvVar9);
            iVar26 = 0;
            pfVar33 = pfVar25;
            do {
              uVar23 = iVar4 + 1U;
              if (0 < iVar4) {
                do {
                  *pfVar33 = *pfVar20 * fVar1 + *pfVar33;
                  pfVar20 = pfVar20 + 2;
                  pfVar33 = pfVar33 + 1;
                  uVar23 = uVar23 - 1;
                } while (1 < uVar23);
              }
              pfVar20 = pfVar20 + iVar22;
              iVar26 = iVar26 + 1;
            } while (iVar26 != iVar5);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar3);
      }
      lVar32 = lVar32 + 1;
      lVar18 = lVar18 + lVar24;
    } while (lVar32 != iVar2);
  }
  return;
}

Assistant:

static void conv1x1s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        int q = 0;

        for (; q+3<inch; q+=4)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);
            const float* img1 = bottom_blob.channel(q+1);
            const float* img2 = bottom_blob.channel(q+2);
            const float* img3 = bottom_blob.channel(q+3);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];
            const float k1 = kernel0[1];
            const float k2 = kernel0[2];
            const float k3 = kernel0[3];

            const float* r0 = img0;
            const float* r1 = img1;
            const float* r2 = img2;
            const float* r3 = img3;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;
                    float sum1 = *r1 * k1;
                    float sum2 = *r2 * k2;
                    float sum3 = *r3 * k3;

                    *outptr += sum + sum1 + sum2 + sum3;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;
                    outptr++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
                r3 += tailstep;
            }

        }

        for (; q<inch; q++)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];

            const float* r0 = img0;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;

                    *outptr += sum;

                    r0 += 2;
                    outptr++;
                }

                r0 += tailstep;
            }

        }
    }

}